

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tang_join_ti_impl.h
# Opt level: O2

bool __thiscall
join::
TangJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::recursive_partitionable
          (TangJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
           *this,BinaryNode<label::StringLabel> *curr_node,int delta,int gamma,
          int *nr_of_subgraphs_found)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  _Head_base<0UL,_node::BinaryNode<label::StringLabel>_*,_false> curr_node_00;
  BinaryNode<label::StringLabel> *curr_node_01;
  bool bVar9;
  int iVar10;
  int iVar11;
  
  curr_node->subgraph_size_ = 1;
  curr_node->detached_ = 0;
  curr_node_00._M_head_impl =
       (curr_node->left_child_)._M_t.
       super___uniq_ptr_impl<node::BinaryNode<label::StringLabel>,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_node::BinaryNode<label::StringLabel>_*,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
       .super__Head_base<0UL,_node::BinaryNode<label::StringLabel>_*,_false>._M_head_impl;
  curr_node_01 = (curr_node->right_child_)._M_t.
                 super___uniq_ptr_impl<node::BinaryNode<label::StringLabel>,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_node::BinaryNode<label::StringLabel>_*,_std::default_delete<node::BinaryNode<label::StringLabel>_>_>
                 .super__Head_base<0UL,_node::BinaryNode<label::StringLabel>_*,_false>._M_head_impl;
  if (curr_node_00._M_head_impl == (BinaryNode<label::StringLabel> *)0x0) {
    iVar10 = 1;
    iVar11 = 0;
  }
  else {
    bVar9 = recursive_partitionable
                      (this,curr_node_00._M_head_impl,delta,gamma,nr_of_subgraphs_found);
    if (bVar9) {
      return true;
    }
    uVar1 = curr_node->subgraph_size_;
    uVar5 = curr_node->detached_;
    uVar2 = (curr_node_00._M_head_impl)->subgraph_size_;
    uVar6 = (curr_node_00._M_head_impl)->detached_;
    iVar10 = uVar2 + uVar1;
    iVar11 = uVar6 + uVar5;
    curr_node->subgraph_size_ = iVar10;
    curr_node->detached_ = iVar11;
  }
  if (curr_node_01 != (BinaryNode<label::StringLabel> *)0x0) {
    bVar9 = recursive_partitionable(this,curr_node_01,delta,gamma,nr_of_subgraphs_found);
    if (bVar9) {
      return true;
    }
    uVar3 = curr_node->subgraph_size_;
    uVar7 = curr_node->detached_;
    uVar4 = curr_node_01->subgraph_size_;
    uVar8 = curr_node_01->detached_;
    iVar10 = uVar4 + uVar3;
    iVar11 = uVar8 + uVar7;
    curr_node->subgraph_size_ = iVar10;
    curr_node->detached_ = iVar11;
  }
  if (gamma <= iVar10 - iVar11) {
    *nr_of_subgraphs_found = *nr_of_subgraphs_found + 1;
    curr_node->detached_ = curr_node->subgraph_size_;
    if (delta <= *nr_of_subgraphs_found) {
      return true;
    }
  }
  return false;
}

Assistant:

bool TangJoinTI<Label, VerificationAlgorithm>::recursive_partitionable(
    node::BinaryNode<Label>* curr_node, int delta, int gamma, 
    int& nr_of_subgraphs_found) {
  
  curr_node->set_subgraph_size(1);
  curr_node->set_detached(0);

  node::BinaryNode<Label>* left_child = curr_node->get_left_child();
  node::BinaryNode<Label>* right_child = curr_node->get_right_child();
  if(left_child != nullptr) {
    if(recursive_partitionable(left_child, delta, gamma, nr_of_subgraphs_found))
      return true;
    curr_node->set_subgraph_size(curr_node->get_subgraph_size() + left_child->get_subgraph_size());
    curr_node->set_detached(curr_node->get_detached() + left_child->get_detached());
  }
  if(right_child != nullptr) {
    if(recursive_partitionable(right_child, delta, gamma, nr_of_subgraphs_found))
      return true;
    curr_node->set_subgraph_size(curr_node->get_subgraph_size() + right_child->get_subgraph_size());
    curr_node->set_detached(curr_node->get_detached() + right_child->get_detached());
  }
  if(curr_node->get_subgraph_size() - curr_node->get_detached() >= gamma) {
    ++nr_of_subgraphs_found;  // identified gamma subtree
    curr_node->set_detached(curr_node->get_subgraph_size());
    if(nr_of_subgraphs_found >= delta)
      return true;  // found (delta, gamma)-partitioning
  }

  return false;
}